

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

CNode * __thiscall CConnman::FindNode(CConnman *this,CNetAddr *ip)

{
  pointer ppCVar1;
  bool bVar2;
  pointer ppCVar3;
  CNode *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  unique_lock<std::recursive_mutex> local_68;
  direct_or_indirect local_58;
  uint local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_68);
  ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar3 != ppCVar1) {
    do {
      pCVar4 = *ppCVar3;
      prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                 (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&pCVar4->addr);
      local_40._0_4_ = (pCVar4->addr).super_CService.super_CNetAddr.m_net;
      local_40._4_4_ = (pCVar4->addr).super_CService.super_CNetAddr.m_scope_id;
      bVar2 = ::operator==((CNetAddr *)&local_58.indirect_contents,ip);
      if (0x10 < local_48) {
        free(local_58.indirect_contents.indirect);
      }
      if (bVar2) goto LAB_008b58ec;
      ppCVar3 = ppCVar3 + 1;
    } while (ppCVar3 != ppCVar1);
  }
  pCVar4 = (CNode *)0x0;
LAB_008b58ec:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::FindNode(const CNetAddr& ip)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
      if (static_cast<CNetAddr>(pnode->addr) == ip) {
            return pnode;
        }
    }
    return nullptr;
}